

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

type __thiscall
nonstd::optional_lite::optional<bool>::operator=(optional<bool> *this,optional<bool> *other)

{
  storage_t<bool> *psVar1;
  value_type_conflict *value;
  
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      this->has_value_ = false;
    }
    else {
      psVar1 = (storage_t<bool> *)operator*(other);
      this->contained = *psVar1;
    }
  }
  else if (other->has_value_ != false) {
    value = operator*(other);
    initialize<bool>(this,value);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }